

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void __thiscall BasePort::~BasePort(BasePort *this)

{
  BasePort *this_local;
  
  this->_vptr_BasePort = (_func_int **)&PTR___cxa_pure_virtual_0012c608;
  if (this->ReadBufferBroadcast != (uchar *)0x0) {
    operator_delete__(this->ReadBufferBroadcast);
  }
  if (this->WriteBufferBroadcast != (uchar *)0x0) {
    operator_delete__(this->WriteBufferBroadcast);
  }
  if (this->GenericBuffer != (uchar *)0x0) {
    operator_delete__(this->GenericBuffer);
  }
  BroadcastReadInfo::~BroadcastReadInfo(&this->bcReadInfo);
  return;
}

Assistant:

BasePort::~BasePort()
{
    delete [] ReadBufferBroadcast;
    delete [] WriteBufferBroadcast;
    delete [] GenericBuffer;
}